

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token __thiscall slang::parsing::Lexer::lexNumericLiteral(Lexer *this)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  bool bVar4;
  int i;
  long lVar5;
  int *piVar6;
  Diagnostic *this_00;
  byte *pbVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  ulong in_R9;
  LiteralBase base;
  byte *pbVar11;
  size_type sVar12;
  double dVar13;
  undefined1 auVar14 [16];
  Token TVar15;
  char c;
  optional<slang::TimeUnit> timeSuffix;
  bool outOfRange;
  SVInt intVal;
  anon_class_16_2_832c79d4 populateChars;
  SmallVector<char,_40UL> floatChars;
  double value;
  pointer local_80;
  size_type sStack_78;
  SmallVector<slang::logic_t,_40UL> digits;
  
  pbVar7 = (byte *)this->sourceBuffer;
  lVar5 = 0;
  while (pbVar11 = pbVar7, pbVar7[lVar5] == "1step"[lVar5]) {
    lVar5 = lVar5 + 1;
    if (lVar5 == 5) {
      this->sourceBuffer = (char *)(pbVar7 + 5);
      TVar15 = create<>(this,OneStep);
      return TVar15;
    }
  }
  while (bVar3 = *pbVar7, bVar3 == 0x30) {
    pbVar7 = pbVar7 + 1;
    this->sourceBuffer = (char *)pbVar7;
    pbVar11 = pbVar11 + 1;
  }
  pcVar1 = this->originalBegin;
  digits.super_SmallVectorBase<slang::logic_t>.data_ =
       (pointer)digits.super_SmallVectorBase<slang::logic_t>.firstElement;
  digits.super_SmallVectorBase<slang::logic_t>.len = 0;
  floatChars.super_SmallVectorBase<char>.data_ = floatChars.super_SmallVectorBase<char>.firstElement
  ;
  floatChars.super_SmallVectorBase<char>.len = 0;
  digits.super_SmallVectorBase<slang::logic_t>.cap = 0x28;
  floatChars.super_SmallVectorBase<char>.cap = 0x28;
  do {
    if (bVar3 != 0x5f) {
      if (9 < (byte)(bVar3 - 0x30)) goto LAB_002a1e55;
      populateChars.digits =
           (SmallVector<slang::logic_t,_40UL> *)CONCAT71(populateChars.digits._1_7_,bVar3 - 0x30);
      SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>
                (&digits.super_SmallVectorBase<slang::logic_t>,(logic_t *)&populateChars);
      pbVar7 = (byte *)this->sourceBuffer;
    }
    this->sourceBuffer = (char *)(pbVar7 + 1);
    bVar3 = pbVar7[1];
    pbVar7 = pbVar7 + 1;
  } while( true );
LAB_002a1ee7:
  if (!bVar4) {
    addDiag(this,(DiagCode)0xd0002,(long)pbVar7 - (long)this->originalBegin);
    intVal.super_SVIntStorage.field_0.val._0_1_ = 0x30;
    SmallVectorBase<char>::emplace_back<char>
              (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
    pbVar7 = (byte *)this->sourceBuffer;
  }
  goto LAB_002a1f12;
LAB_002a2016:
  if ((bool)(sVar12 != 0 | bVar4)) {
    pcVar8 = this->sourceBuffer;
    this->sourceBuffer = pcVar8 + uVar10;
    if (!bVar4) {
      addDiag(this,(DiagCode)0xc0002,(size_t)(pcVar8 + (uVar10 - (long)this->originalBegin)));
      intVal.super_SVIntStorage.field_0.val._0_1_ = 0x31;
      SmallVectorBase<char>::emplace_back<char>
                (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
    }
    bVar3 = 0;
    goto LAB_002a2067;
  }
  floatChars.super_SmallVectorBase<char>.len = 0;
  goto LAB_002a2100;
LAB_002a1e55:
  populateChars.floatChars = &floatChars;
  populateChars.digits =
       (SmallVector<slang::logic_t,_40UL> *)&digits.super_SmallVectorBase<slang::logic_t>;
  if (*pbVar7 == 0x2e) {
    this->sourceBuffer = (char *)(pbVar7 + 1);
    lexNumericLiteral::anon_class_16_2_832c79d4::operator()(&populateChars);
    intVal.super_SVIntStorage.field_0.val._0_1_ = 0x2e;
    SmallVectorBase<char>::emplace_back<char>
              (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
    pbVar7 = (byte *)this->sourceBuffer;
    if (*pbVar7 == 0x5f) {
      addDiag(this,(DiagCode)0x50002,(long)pbVar7 - (long)this->originalBegin);
      pbVar7 = (byte *)this->sourceBuffer;
    }
    bVar4 = false;
    do {
      bVar3 = *pbVar7;
      intVal.super_SVIntStorage.field_0.val._0_1_ = bVar3;
      if (bVar3 != 0x5f) {
        if (9 < (byte)(bVar3 - 0x30)) goto LAB_002a1ee7;
        SmallVectorBase<char>::emplace_back<char_const&>
                  (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
        pbVar7 = (byte *)this->sourceBuffer;
        bVar4 = true;
      }
      pbVar7 = pbVar7 + 1;
      this->sourceBuffer = (char *)pbVar7;
    } while( true );
  }
LAB_002a1f12:
  sVar12 = floatChars.super_SmallVectorBase<char>.len;
  timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeUnit>._M_engaged = false;
  c = *pbVar7;
  if ((c & 0xdfU) == 0x45) {
    if (floatChars.super_SmallVectorBase<char>.len == 0) {
      lexNumericLiteral::anon_class_16_2_832c79d4::operator()(&populateChars);
    }
    intVal.super_SVIntStorage.field_0.val._0_1_ = 0x65;
    SmallVectorBase<char>::emplace_back<char>
              (&floatChars.super_SmallVectorBase<char>,(char *)&intVal);
    pcVar8 = this->sourceBuffer;
    c = pcVar8[1];
    if ((c == '-') || (c == '+')) {
      SmallVectorBase<char>::emplace_back<char_const&>(&floatChars.super_SmallVectorBase<char>,&c);
      uVar9 = 2;
      pcVar8 = this->sourceBuffer;
      c = pcVar8[2];
    }
    else {
      uVar9 = 1;
    }
    if ((sVar12 != 0) && (c == '_')) {
      addDiag(this,(DiagCode)0x50002,(long)pcVar8 - (long)this->originalBegin);
    }
    uVar10 = (ulong)uVar9;
    bVar4 = false;
    do {
      if (c != '_') {
        if (9 < (byte)(c - 0x30U)) goto LAB_002a2016;
        bVar4 = true;
        SmallVectorBase<char>::emplace_back<char_const&>(&floatChars.super_SmallVectorBase<char>,&c)
        ;
      }
      c = this->sourceBuffer[uVar10 + 1];
      uVar10 = uVar10 + 1;
    } while( true );
  }
  timeSuffix = lexTimeLiteral(this);
  bVar3 = timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeUnit>._M_engaged;
  if (((ushort)timeSuffix.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
               super__Optional_payload_base<slang::TimeUnit> >> 8 & 1) == 0) {
LAB_002a2067:
    if (floatChars.super_SmallVectorBase<char>.len == 0) {
LAB_002a2100:
      sVar12 = digits.super_SmallVectorBase<slang::logic_t>.len;
      intVal.super_SVIntStorage.field_0.val = 0;
      intVal.super_SVIntStorage.bitWidth = 1;
      intVal.super_SVIntStorage.signFlag = false;
      intVal.super_SVIntStorage.unknownFlag = false;
      if (digits.super_SmallVectorBase<slang::logic_t>.len != 0) {
        auVar14._8_4_ = (int)(digits.super_SmallVectorBase<slang::logic_t>.len >> 0x20);
        auVar14._0_8_ = digits.super_SmallVectorBase<slang::logic_t>.len;
        auVar14._12_4_ = 0x45300000;
        dVar13 = ceil(((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,
                                        (int)digits.super_SmallVectorBase<slang::logic_t>.len) -
                      4503599627370496.0)) * 3.321928094887362);
        if (dVar13 <= 16777215.0) {
          base = (LiteralBase)(long)dVar13;
        }
        else {
          this_00 = addDiag(this,(DiagCode)0x20003,(long)pbVar11 - (long)pcVar1);
          base = ~Binary;
          Diagnostic::operator<<(this_00,0xffffff);
          sVar12 = digits.super_SmallVectorBase<slang::logic_t>.len;
        }
        local_80 = digits.super_SmallVectorBase<slang::logic_t>.data_;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = in_R9;
        sStack_78 = sVar12;
        SVInt::fromDigits((bitwidth_t)&value,base,true,false,
                          (span<const_slang::logic_t,_18446744073709551615UL>)(auVar2 << 0x40));
        SVInt::operator=(&intVal,(SVInt *)&value);
        SVInt::~SVInt((SVInt *)&value);
        SVInt::shrinkToFit(&intVal);
      }
      TVar15 = create<slang::SVInt&>(this,IntegerLiteral,&intVal);
      SVInt::~SVInt(&intVal);
      goto LAB_002a2219;
    }
  }
  else if (floatChars.super_SmallVectorBase<char>.len == 0) {
    lexNumericLiteral::anon_class_16_2_832c79d4::operator()(&populateChars);
    goto LAB_002a2067;
  }
  intVal.super_SVIntStorage.field_0.val = intVal.super_SVIntStorage.field_0.val & 0xffffffffffffff00
  ;
  SmallVectorBase<char>::emplace_back<char>(&floatChars.super_SmallVectorBase<char>,(char *)&intVal)
  ;
  piVar6 = __errno_location();
  *piVar6 = 0;
  value = strtod(floatChars.super_SmallVectorBase<char>.data_,(char **)&intVal);
  if ((pointer)intVal.super_SVIntStorage.field_0.val !=
      floatChars.super_SmallVectorBase<char>.data_ +
      (floatChars.super_SmallVectorBase<char>.len - 1)) {
    assert::assertFailed
              ("end == floatChars.end() - 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Lexer.cpp"
               ,0x3d2,"Token slang::parsing::Lexer::lexNumericLiteral()");
  }
  outOfRange = *piVar6 == 0x22;
  TVar15 = create<double&,bool&,std::optional<slang::TimeUnit>&>
                     (this,bVar3 & EndOfFile | RealLiteral,&value,&outOfRange,&timeSuffix);
LAB_002a2219:
  SmallVectorBase<char>::~SmallVectorBase(&floatChars.super_SmallVectorBase<char>);
  SmallVectorBase<slang::logic_t>::~SmallVectorBase(&digits.super_SmallVectorBase<slang::logic_t>);
  return TVar15;
}

Assistant:

Token Lexer::lexNumericLiteral() {
    // have to check for the "1step" magic keyword
    static const char OneStepText[] = "1step";
    for (int i = 0; i < (int)sizeof(OneStepText) - 1; i++) {
        if (peek(i) != OneStepText[i])
            break;
        if (i == sizeof(OneStepText) - 2) {
            advance(sizeof(OneStepText) - 1);
            return create(TokenKind::OneStep);
        }
    }

    // scan past leading zeros
    while (peek() == '0')
        advance();

    // Keep track of digits as we iterate through them; convert them
    // into logic_t to pass into the SVInt parsing method. If it turns out
    // that this is actually a float, we'll go back and populate `floatChars`
    // instead. Since we expect many more ints than floats, it makes sense to
    // not waste time populating that array up front.
    size_t startOfNum = currentOffset();
    SmallVector<logic_t> digits;
    SmallVector<char> floatChars;

    while (true) {
        char c = peek();
        if (c == '_')
            advance();
        else if (!isDecimalDigit(c))
            break;
        else {
            digits.push_back(logic_t(getDigitValue(c)));
            advance();
        }
    }

    auto populateChars = [&]() {
        if (digits.empty())
            floatChars.push_back('0');
        else {
            for (auto d : digits)
                floatChars.push_back(char((char)d.value + '0'));
        }
    };

    // Check for fractional digits.
    if (peek() == '.') {
        advance();
        populateChars();
        floatChars.push_back('.');

        if (peek() == '_')
            addDiag(diag::DigitsLeadingUnderscore, currentOffset());

        bool any = false;
        while (true) {
            char c = peek();
            if (c == '_')
                advance();
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                advance();
            }
        }

        if (!any) {
            addDiag(diag::MissingFractionalDigits, currentOffset());
            floatChars.push_back('0');
        }
    }

    // Check for an exponent. Note that this case can be indistinguishable from
    // the vector digits for a hex literal, so we can't issue any errors here if
    // we don't have a decimal point (from above).
    //
    // Consider this nasty case we need to support:
    // `FOO 3e+2
    // If `FOO is defined to be 'h this represents an expression: 62 + 2
    // Otherwise, this represents a real literal: 300.0

    std::optional<TimeUnit> timeSuffix;
    char c = peek();
    if (c == 'e' || c == 'E') {
        bool hasDecimal = !floatChars.empty();
        if (!hasDecimal)
            populateChars();

        floatChars.push_back('e');

        // skip over leading sign
        int index = 1;
        c = peek(index);
        if (c == '+' || c == '-') {
            floatChars.push_back(c);
            c = peek(++index);
        }

        if (c == '_' && hasDecimal)
            addDiag(diag::DigitsLeadingUnderscore, currentOffset());

        bool any = false;
        while (true) {
            if (c == '_')
                c = peek(++index);
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                c = peek(++index);
            }
        }

        if (any || hasDecimal) {
            advance(index);
            if (!any) {
                addDiag(diag::MissingExponentDigits, currentOffset());
                floatChars.push_back('1');
            }
        }
        else {
            // This isn't a float, it's probably a hex literal. Back up (by not calling advance)
            // and clear out the floatChars array so we don't think it should be a float.
            floatChars.clear();
        }
    }
    else {
        // Check for a time literal suffix directly adjacent. Time literal
        // values are always interpreted as doubles.
        timeSuffix = lexTimeLiteral();
        if (timeSuffix && floatChars.empty())
            populateChars();
    }

    if (!floatChars.empty()) {
        // We have a floating point result. Let the standard library do the heavy lifting of
        // converting and rounding correctly. Note that we depend on this code returning
        // 0 for underflow and +inf for overflow.
        floatChars.push_back('\0');

        char* end;
        errno = 0;
        double value = strtod(floatChars.data(), &end);
        ASSERT(end == floatChars.end() - 1); // should never error

        // If we had an overflow or underflow, errno is now ERANGE. We can't warn here in case
        // this turns out to actually be a hex literal. Have the token carry this info so someone
        // can check it later if they care.
        bool outOfRange = errno == ERANGE;

        return create(timeSuffix ? TokenKind::TimeLiteral : TokenKind::RealLiteral, value,
                      outOfRange, timeSuffix);
    }

    // normal numeric literal
    SVInt intVal;
    if (!digits.empty()) {
        double bitsDbl = ceil(BitsPerDecimal * double(digits.size()));
        bitwidth_t bits;
        if (bitsDbl <= double(SVInt::MAX_BITS))
            bits = (bitwidth_t)bitsDbl;
        else {
            addDiag(diag::LiteralSizeTooLarge, startOfNum) << (int)SVInt::MAX_BITS;
            bits = SVInt::MAX_BITS;
        }

        intVal = SVInt::fromDigits(bits, LiteralBase::Decimal, false, false, digits);
        intVal.shrinkToFit();
    }

    return create(TokenKind::IntegerLiteral, intVal);
}